

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_gz.c
# Opt level: O2

void * nhr_gz_compress(void *buff,size_t buff_size,size_t *compressed_size,uchar method)

{
  bool bVar1;
  uLong uVar2;
  int iVar3;
  undefined4 *mem;
  time_t tVar4;
  ulong uVar5;
  undefined8 uVar6;
  size_t sVar7;
  size_t new_size;
  long lVar8;
  long lVar9;
  z_stream zip;
  
  if (buff_size == 0 || buff == (void *)0x0) {
    return (void *)0x0;
  }
  zip.adler = 0;
  zip.reserved = 0;
  zip.opaque = (voidpf)0x0;
  zip.data_type = 0;
  zip._92_4_ = 0;
  zip.zalloc = (alloc_func)0x0;
  zip.zfree = (free_func)0x0;
  zip.msg = (char *)0x0;
  zip.state = (internal_state *)0x0;
  zip.avail_out = 0;
  zip._36_4_ = 0;
  zip.total_out = 0;
  zip.total_in = 0;
  zip.next_out = (Bytef *)0x0;
  zip.next_in = (Bytef *)0x0;
  zip.avail_in = 0;
  zip._12_4_ = 0;
  if (method == '\0') {
    iVar3 = deflateInit_(&zip,9,"1.2.11",0x70);
    if (iVar3 != 0) {
      return (void *)0x0;
    }
  }
  else {
    iVar3 = deflateInit2_(&zip,9,8,0xfffffffffffffff1,8,0,"1.2.11",0x70);
    if (iVar3 != 0) {
      return (void *)0x0;
    }
    if (method == '\x01') {
      new_size = 0x20a;
      mem = (undefined4 *)nhr_malloc(0x20a);
      tVar4 = time((time_t *)0x0);
      *mem = 0x88b1f;
      mem[1] = (int)tVar4;
      *(undefined2 *)(mem + 2) = 0;
      lVar8 = 10;
      bVar1 = true;
      goto LAB_00104ba5;
    }
  }
  new_size = 0x200;
  mem = (undefined4 *)nhr_malloc(0x200);
  bVar1 = false;
  lVar8 = 0;
LAB_00104ba5:
  zip.avail_in = (uInt)buff_size;
  zip.avail_out = 0x200;
  zip.next_out = (Bytef *)((long)mem + lVar8);
  uVar5 = buff_size & 0xffffffff;
  zip.next_in = (Bytef *)buff;
  while ((int)uVar5 != 0) {
    iVar3 = deflate(&zip,0);
    if (iVar3 != 0) goto LAB_00104ce0;
    lVar9 = lVar8;
    if (zip.avail_out == 0) {
      new_size = new_size + 0x200;
      lVar9 = lVar8 + 0x200;
      mem = (undefined4 *)nhr_realloc(mem,new_size);
      zip.next_out = (Bytef *)((long)mem + lVar8 + 0x200);
      zip.avail_out = 0x200;
    }
    lVar8 = lVar9;
    uVar5 = zip._8_8_ & 0xffffffff;
  }
  do {
    lVar9 = lVar8;
    if (zip.avail_out == 0) {
      new_size = new_size + 0x200;
      lVar9 = lVar8 + 0x200;
      mem = (undefined4 *)nhr_realloc(mem,new_size);
      zip.next_out = (Bytef *)((long)mem + lVar8 + 0x200);
      zip.avail_out = 0x200;
    }
    iVar3 = deflate(&zip,4);
    uVar2 = zip.total_out;
    lVar8 = lVar9;
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    sVar7 = zip.total_out;
    if (bVar1) {
      if ((new_size - zip.total_out) - 10 < 8) {
        mem = (undefined4 *)nhr_realloc(mem,new_size + 8);
      }
      uVar6 = crc32(0,0,0);
      uVar6 = crc32(uVar6,buff,buff_size & 0xffffffff);
      *(undefined8 *)((long)mem + uVar2 + 10) = uVar6;
      *(size_t *)((long)mem + uVar2 + 0x12) = buff_size;
      sVar7 = uVar2 + 0x12;
    }
    if (compressed_size != (size_t *)0x0) {
      *compressed_size = sVar7;
    }
    deflateEnd(&zip);
    return mem;
  }
LAB_00104ce0:
  deflateEnd(&zip);
  nhr_free(mem);
  return (void *)0x0;
}

Assistant:

void * nhr_gz_compress(const void * buff,
					   const size_t buff_size,
					   size_t * compressed_size,
					   const unsigned char method) {
	z_stream zip;
	Bytef * out_buff = NULL;
	size_t writed = 0, out_size = NHR_GZ_CHUNK_SIZE;
	int result = Z_STREAM_ERROR;
	
	if (!buff || buff_size == 0) {
		return NULL;
	}
	memset(&zip, 0, sizeof(z_stream));

	if (method == NHR_GZ_METHOD_DEFLATE) {
		result = deflateInit(&zip, Z_BEST_COMPRESSION);
	} else {
		result = deflateInit2(&zip, Z_BEST_COMPRESSION, Z_DEFLATED, NHR_GZ_WINDOWS_BITS, 8, Z_DEFAULT_STRATEGY);
	}

	if (result != Z_OK) {
		return NULL;
	}

	if (method == NHR_GZ_METHOD_GZIP) {
		out_size += NHR_GZ_HEADER_SIZE;
		out_buff = (Bytef *)nhr_malloc(out_size);
		nhr_gz_write_header(out_buff);
		writed += NHR_GZ_HEADER_SIZE;
	} else {
		out_buff = (Bytef *)nhr_malloc(out_size);
	}

	zip.avail_in = (uInt)buff_size;
	zip.next_in = (Bytef *)buff;
	zip.avail_out = NHR_GZ_CHUNK_SIZE;
	zip.next_out = out_buff + writed;

	while (zip.avail_in) {
		if (deflate(&zip, Z_NO_FLUSH) != Z_OK) {
			deflateEnd(&zip);
			nhr_free(out_buff);
			return NULL;
		}
		if (zip.avail_out == 0) {
			out_size += NHR_GZ_CHUNK_SIZE;
			writed += NHR_GZ_CHUNK_SIZE;
			out_buff = (Bytef *)nhr_realloc(out_buff, out_size);
			zip.next_out = out_buff + writed;
			zip.avail_out = NHR_GZ_CHUNK_SIZE;
		}
	}

	do {
		if (zip.avail_out == 0) {
			out_size += NHR_GZ_CHUNK_SIZE;
			writed += NHR_GZ_CHUNK_SIZE;
			out_buff = (Bytef *)nhr_realloc(out_buff, out_size);
			zip.next_out = out_buff + writed;
			zip.avail_out = NHR_GZ_CHUNK_SIZE;
		}
		result = deflate(&zip, Z_FINISH);
	} while (result == Z_OK);

	if (result != Z_STREAM_END) {
		deflateEnd(&zip);
		nhr_free(out_buff);
		return NULL;
	}

	writed = zip.total_out; // write total from zip stream
	if (method == NHR_GZ_METHOD_GZIP) {
		writed += NHR_GZ_HEADER_SIZE;
		out_buff = nhr_gz_write_footer(out_buff, out_size, writed, buff, buff_size);
		writed += NHR_GZ_FOOTER_SIZE;
	}

	if (compressed_size) {
		*compressed_size = writed;
	}

	deflateEnd(&zip);
	return out_buff;
}